

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettyprint.cc
# Opt level: O1

void __thiscall EmitPrettyPrint::~EmitPrettyPrint(EmitPrettyPrint *this)

{
  ~EmitPrettyPrint(this);
  operator_delete(this);
  return;
}

Assistant:

EmitPrettyPrint::~EmitPrettyPrint(void)

{
  delete lowlevel;
}